

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     swap_offsets<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
               __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last,
               uchar *offsets_l,uchar *offsets_r,size_t num,bool use_swaps)

{
  double dVar1;
  byte bVar2;
  size_t i;
  size_t sVar3;
  double *pdVar4;
  undefined7 in_register_00000089;
  
  if ((int)CONCAT71(in_register_00000089,use_swaps) == 0) {
    if (num != 0) {
      pdVar4 = last._M_current + -(ulong)*offsets_r;
      dVar1 = first._M_current[*offsets_l];
      first._M_current[*offsets_l] = *pdVar4;
      for (sVar3 = 1; num != sVar3; sVar3 = sVar3 + 1) {
        bVar2 = offsets_l[sVar3];
        *pdVar4 = first._M_current[bVar2];
        pdVar4 = last._M_current + -(ulong)offsets_r[sVar3];
        first._M_current[bVar2] = *pdVar4;
      }
      *pdVar4 = dVar1;
    }
  }
  else {
    for (sVar3 = 0; num != sVar3; sVar3 = sVar3 + 1) {
      bVar2 = offsets_r[sVar3];
      dVar1 = first._M_current[offsets_l[sVar3]];
      first._M_current[offsets_l[sVar3]] = last._M_current[-(ulong)bVar2];
      last._M_current[-(ulong)bVar2] = dVar1;
    }
  }
  return;
}

Assistant:

inline void swap_offsets(Iter first, Iter last,
                             unsigned char* offsets_l, unsigned char* offsets_r,
                             size_t num, bool use_swaps) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (use_swaps) {
            // This case is needed for the descending distribution, where we need
            // to have proper swapping for pdqsort to remain O(n).
            for (size_t i = 0; i < num; ++i) {
                std::iter_swap(first + offsets_l[i], last - offsets_r[i]);
            }
        } else if (num > 0) {
            Iter l = first + offsets_l[0]; Iter r = last - offsets_r[0];
            T tmp(PDQSORT_PREFER_MOVE(*l)); *l = PDQSORT_PREFER_MOVE(*r);
            for (size_t i = 1; i < num; ++i) {
                l = first + offsets_l[i]; *r = PDQSORT_PREFER_MOVE(*l);
                r = last - offsets_r[i]; *l = PDQSORT_PREFER_MOVE(*r);
            }
            *r = PDQSORT_PREFER_MOVE(tmp);
        }
    }